

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  int iVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  TValue k;
  Value local_30;
  undefined4 local_28;
  
  pTVar3 = luaH_getint(t,key);
  if (pTVar3 == &luaO_nilobject_) {
    local_28 = 0x13;
    local_30.i = key;
    pTVar3 = luaH_newkey(L,t,(TValue *)&local_30);
  }
  iVar1 = value->tt_;
  uVar2 = *(undefined4 *)&value->field_0xc;
  pTVar3->value_ = value->value_;
  pTVar3->tt_ = iVar1;
  *(undefined4 *)&pTVar3->field_0xc = uVar2;
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  const TValue *p = luaH_getint(t, key);
  TValue *cell;
  if (p != luaO_nilobject)
    cell = cast(TValue *, p);
  else {
    TValue k;
    setivalue(&k, key);
    cell = luaH_newkey(L, t, &k);
  }
  setobj2t(L, cell, value);
}